

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O0

void __thiscall SynthWidget::handleMIDISessionAdded(SynthWidget *this,MidiSession *midiSession)

{
  QListWidgetItem *this_00;
  QObject **value;
  undefined1 local_70 [43];
  undefined1 local_45;
  QString local_38;
  QListWidgetItem *local_20;
  QListWidgetItem *item;
  MidiSession *midiSession_local;
  SynthWidget *this_local;
  
  item = (QListWidgetItem *)midiSession;
  midiSession_local = (MidiSession *)this;
  this_00 = (QListWidgetItem *)operator_new(0x28);
  local_45 = 1;
  MidiSession::getName(&local_38,(MidiSession *)item);
  QListWidgetItem::QListWidgetItem
            (this_00,(QString *)&local_38,(this->ui->super_Ui_SynthWidget).midiList,0);
  local_45 = 0;
  QString::~QString(&local_38);
  local_70._0_8_ = item;
  local_20 = this_00;
  QVariant::fromValue<QObject*>
            ((enable_if_t<std::is_copy_constructible_v<QObject_*>,_QVariant> *)(local_70 + 8),
             (QVariant *)local_70,value);
  (**(code **)(*(long *)this_00 + 0x20))
            (this_00,0x100,
             (enable_if_t<std::is_copy_constructible_v<QObject_*>,_QVariant> *)(local_70 + 8));
  QVariant::~QVariant((QVariant *)(local_70 + 8));
  QListWidget::addItem((this->ui->super_Ui_SynthWidget).midiList,local_20);
  updateMidiAddActionEnabled(this->ui);
  return;
}

Assistant:

void SynthWidget::handleMIDISessionAdded(MidiSession *midiSession) {
	QListWidgetItem *item = new QListWidgetItem(midiSession->getName(), ui->midiList);
	item->setData(Qt::UserRole, QVariant::fromValue((QObject *)midiSession));
	ui->midiList->addItem(item);
	updateMidiAddActionEnabled(ui);
}